

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsInstPrinter.c
# Opt level: O3

void printOperand(MCInst *MI,uint OpNo,SStream *O)

{
  uint8_t *puVar1;
  cs_detail *pcVar2;
  _Bool _Var3;
  byte bVar4;
  uint uVar5;
  MCOperand *op;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  char *fmt;
  uint8_t uVar9;
  uint8_t uVar11;
  uint8_t uVar12;
  uint8_t uVar10;
  
  op = MCInst_getOperand(MI,OpNo);
  _Var3 = MCOperand_isReg(op);
  if (_Var3) {
    uVar5 = MCOperand_getReg(op);
    SStream_concat0(O,&getRegisterName_AsmStrs +
                      *(uint *)(getRegisterName_RegAsmOffset + (ulong)(uVar5 - 1) * 4));
    if (MI->csh->detail != CS_OPT_OFF) {
      pcVar2 = MI->flat_insn->detail;
      uVar7 = (uint)(pcVar2->field_6).x86.op_count;
      if (MI->csh->doing_mem == true) {
        *(uint *)(pcVar2->groups + (ulong)(uVar7 * 0x30) + 0x4a) = uVar5;
      }
      else {
        puVar1 = pcVar2->groups + (ulong)(uVar7 * 0x30) + 0x3e;
        puVar1[0] = '\x01';
        puVar1[1] = '\0';
        puVar1[2] = '\0';
        puVar1[3] = '\0';
        pcVar2 = MI->flat_insn->detail;
        *(uint *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x46) =
             uVar5;
        pcVar2 = MI->flat_insn->detail;
        pcVar2->groups[(ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x5e] =
             MI->csh->regsize_map[uVar5];
        puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
        *puVar1 = *puVar1 + '\x01';
      }
    }
    if (MI->op1_size != '\0') {
      return;
    }
    MI->op1_size = MI->csh->regsize_map[uVar5];
    return;
  }
  _Var3 = MCOperand_isImm(op);
  if (!_Var3) {
    return;
  }
  uVar6 = MCOperand_getImm(op);
  uVar5 = MCInst_getOpcode(MI);
  uVar10 = '\0';
  uVar9 = '\0';
  uVar12 = uVar9;
  uVar11 = uVar10;
  if ((int)uVar5 < 0x905) {
    if ((int)uVar5 < 0x4df) {
      if ((int)uVar5 < 0xc6) {
        if (((0x33 < uVar5 - 0x3b) ||
            ((0xd80000000000bU >> ((ulong)(uVar5 - 0x3b) & 0x3f) & 1) == 0)) && (1 < uVar5 - 0x15))
        goto LAB_001a26dd;
      }
      else if ((0x10 < uVar5 - 0x212) || ((0x16201U >> (uVar5 - 0x212 & 0x1f) & 1) == 0)) {
        uVar5 = uVar5 - 0xc6;
        goto LAB_001a2672;
      }
      goto LAB_001a26d6;
    }
    if ((int)uVar5 < 0x75a) {
      if ((uVar5 - 0x4df < 0x36) &&
         ((0x20040040000801U >> ((ulong)(uVar5 - 0x4df) & 0x3f) & 1) != 0)) goto LAB_001a26d6;
      uVar5 = uVar5 - 0x662;
      if (uVar5 < 7) {
        uVar7 = 0x61;
        goto LAB_001a2638;
      }
    }
    else if (((uVar5 - 0x75a < 0x11) && ((0x1001bU >> (uVar5 - 0x75a & 0x1f) & 1) != 0)) ||
            (uVar5 == 0x8d6)) goto LAB_001a26d6;
  }
  else {
    if ((int)uVar5 < 0xa49) {
      if (((0x3f < uVar5 - 0x9ae) ||
          ((0xb000000012000009U >> ((ulong)(uVar5 - 0x9ae) & 0x3f) & 1) == 0)) &&
         ((0x23 < uVar5 - 0x905 || ((0x900000009U >> ((ulong)(uVar5 - 0x905) & 0x3f) & 1) == 0)))) {
        uVar5 = uVar5 - 0x966;
        if (uVar5 < 0x1c) {
          uVar7 = 0x9000009;
LAB_001a2638:
          if ((uVar7 >> (uVar5 & 0x1f) & 1) != 0) goto LAB_001a26d6;
        }
        goto LAB_001a26dd;
      }
    }
    else if ((int)uVar5 < 0xb54) {
      if ((0x2b < uVar5 - 0xa49) || ((0x90000000009U >> ((ulong)(uVar5 - 0xa49) & 0x3f) & 1) == 0))
      {
        uVar5 = uVar5 - 0xaed;
        goto LAB_001a2672;
      }
    }
    else if (5 < uVar5 - 0xb54) {
      uVar5 = uVar5 - 0x1863;
LAB_001a2672:
      uVar12 = '\0';
      uVar11 = '\0';
      if ((4 < uVar5) || (uVar12 = uVar9, uVar11 = uVar10, uVar5 == 2)) goto LAB_001a26dd;
    }
LAB_001a26d6:
    uVar6 = uVar6 & 0xff;
    uVar12 = '\x01';
    uVar11 = '\x01';
  }
LAB_001a26dd:
  uVar5 = MI->flat_insn->id;
  if ((int)uVar5 < 0x9c) {
    if (uVar5 == 0x19) {
LAB_001a2727:
      if (9 < uVar6) {
        bVar4 = MI->op1_size;
        if (bVar4 == 0) {
          bVar4 = MI->imm_size;
        }
        uVar6 = uVar6 & arch_masks[bVar4];
LAB_001a2772:
        fmt = "0x%lx";
        uVar8 = uVar6;
        goto LAB_001a2797;
      }
    }
    else {
      if (uVar5 != 0x95) goto LAB_001a277b;
      if (9 < uVar6) {
        uVar8 = uVar6 & 0xffff;
        fmt = "0x%x";
        uVar6 = uVar8;
        goto LAB_001a2797;
      }
    }
    fmt = "%u";
    uVar8 = uVar6;
  }
  else {
    if (uVar5 - 0x9c < 2) {
      uVar12 = '\x02';
      if (OpNo != 1) {
        uVar12 = uVar11;
      }
      if (OpNo == 1) {
        uVar6 = uVar6 & 0xffff;
      }
      if (9 < (long)uVar6) goto LAB_001a2772;
    }
    else {
      if ((uVar5 == 0x145) || (uVar5 == 0x147)) goto LAB_001a2727;
LAB_001a277b:
      if ((long)uVar6 < 0) {
        uVar8 = -uVar6;
        if (uVar6 < 0xfffffffffffffff7) {
          fmt = "-0x%lx";
        }
        else {
          fmt = "-%lu";
        }
        goto LAB_001a2797;
      }
      if (9 < uVar6) goto LAB_001a2772;
    }
    fmt = "%lu";
    uVar8 = uVar6;
  }
LAB_001a2797:
  SStream_concat(O,fmt,uVar8);
  if (MI->csh->detail != CS_OPT_OFF) {
    pcVar2 = MI->flat_insn->detail;
    uVar5 = (uint)(pcVar2->field_6).x86.op_count;
    if (MI->csh->doing_mem == true) {
      *(ulong *)(pcVar2->groups + (ulong)(uVar5 * 0x30) + 0x56) = uVar6;
    }
    else {
      puVar1 = pcVar2->groups + (ulong)(uVar5 * 0x30) + 0x3e;
      puVar1[0] = '\x02';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pcVar2 = MI->flat_insn->detail;
      if (uVar12 == '\0') {
        bVar4 = (pcVar2->field_6).x86.op_count;
        if (bVar4 == 0) {
          *(uint8_t *)((long)&pcVar2->field_6 + 0x50) = MI->imm_size;
        }
        else {
          if ((MI->flat_insn->id & 0xfffffffe) == 0x9c) {
            uVar12 = MI->imm_size;
          }
          else {
            uVar12 = *(uint8_t *)((long)&pcVar2->field_6 + 0x50);
          }
          pcVar2->groups[(ulong)((uint)bVar4 * 0x30) + 0x5e] = uVar12;
        }
      }
      else {
        pcVar2->groups[(ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x5e] = uVar12;
      }
      pcVar2 = MI->flat_insn->detail;
      *(ulong *)(pcVar2->groups + (ulong)((uint)(pcVar2->field_6).x86.op_count * 0x30) + 0x46) =
           uVar6;
      puVar1 = &(MI->flat_insn->detail->field_6).x86.op_count;
      *puVar1 = *puVar1 + '\x01';
    }
  }
  return;
}

Assistant:

static void printOperand(MCInst *MI, unsigned OpNo, SStream *O)
{
	MCOperand *Op;

	if (OpNo >= MI->size)
		return;

	Op = MCInst_getOperand(MI, OpNo);
	if (MCOperand_isReg(Op)) {
		unsigned int reg = MCOperand_getReg(Op);
		printRegName(O, reg);
		reg = Mips_map_register(reg);
		if (MI->csh->detail) {
			if (MI->csh->doing_mem) {
				MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].mem.base = reg;
			} else {
				MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].type = MIPS_OP_REG;
				MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].reg = reg;
				MI->flat_insn->detail->mips.op_count++;
			}
		}
	} else if (MCOperand_isImm(Op)) {
		int64_t imm = MCOperand_getImm(Op);
		if (MI->csh->doing_mem) {
			if (imm) {	// only print Imm offset if it is not 0
				if (imm >= 0) {
					if (imm > HEX_THRESHOLD)
						SStream_concat(O, "0x%"PRIx64, imm);
					else
						SStream_concat(O, "%"PRIu64, imm);
				} else {
					if (imm < -HEX_THRESHOLD)
						SStream_concat(O, "-0x%"PRIx64, -imm);
					else
						SStream_concat(O, "-%"PRIu64, -imm);
				}
			}
			if (MI->csh->detail)
				MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].mem.disp = imm;
		} else {
			if (imm >= 0) {
				if (imm > HEX_THRESHOLD)
					SStream_concat(O, "0x%"PRIx64, imm);
				else
					SStream_concat(O, "%"PRIu64, imm);
			} else {
				if (imm < -HEX_THRESHOLD)
					SStream_concat(O, "-0x%"PRIx64, -imm);
				else
					SStream_concat(O, "-%"PRIu64, -imm);
			}

			if (MI->csh->detail) {
				MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].type = MIPS_OP_IMM;
				MI->flat_insn->detail->mips.operands[MI->flat_insn->detail->mips.op_count].imm = imm;
				MI->flat_insn->detail->mips.op_count++;
			}
		}
	}
}